

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O3

void __thiscall mathOps_trigSin_Test::~mathOps_trigSin_Test(mathOps_trigSin_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(mathOps, trigSin)
{
    measurement m1(constants::pi / 4.0, rad);
    EXPECT_FLOAT_EQ(sin(m1), sin(constants::pi / 4.0));

    measurement m2(45.0, deg);
    EXPECT_FLOAT_EQ(sin(m2), sin(constants::pi / 4.0));

    precise_measurement m3(constants::pi / 4.0, precise::rad);
    EXPECT_DOUBLE_EQ(sin(m3), sin(constants::pi / 4.0));

    precise_measurement m4(45.0, precise::deg);
    EXPECT_DOUBLE_EQ(sin(m4), sin(constants::pi / 4.0));
}